

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Float __thiscall pbrt::PortalImageInfiniteLight::Area(PortalImageInfiniteLight *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar3 = vinsertps_avx(*(undefined1 (*) [16])((this->portal).values + 1),
                         ZEXT416((uint)(this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x)
                         ,0x10);
  auVar4 = vinsertps_avx(*(undefined1 (*) [16])
                          &(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y,
                         ZEXT416((uint)(this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y)
                         ,0x10);
  auVar5 = vinsertps_avx(*(undefined1 (*) [16])
                          &(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z,
                         ZEXT416((uint)(this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z)
                         ,0x10);
  fVar1 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar2._4_4_ = fVar1;
  auVar2._0_4_ = fVar1;
  auVar2._8_4_ = fVar1;
  auVar2._12_4_ = fVar1;
  auVar2 = vsubps_avx512vl(auVar3,auVar2);
  fVar1 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar3._4_4_ = fVar1;
  auVar3._0_4_ = fVar1;
  auVar3._8_4_ = fVar1;
  auVar3._12_4_ = fVar1;
  auVar3 = vsubps_avx512vl(auVar4,auVar3);
  fVar1 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._4_4_ = fVar1;
  auVar4._0_4_ = fVar1;
  auVar4._8_4_ = fVar1;
  auVar4._12_4_ = fVar1;
  auVar4 = vsubps_avx512vl(auVar5,auVar4);
  auVar5._0_4_ = auVar2._0_4_ * auVar2._0_4_ + auVar3._0_4_ * auVar3._0_4_ +
                 auVar4._0_4_ * auVar4._0_4_;
  auVar5._4_4_ = auVar2._4_4_ * auVar2._4_4_ + auVar3._4_4_ * auVar3._4_4_ +
                 auVar4._4_4_ * auVar4._4_4_;
  auVar5._8_4_ = auVar2._8_4_ * auVar2._8_4_ + auVar3._8_4_ * auVar3._8_4_ +
                 auVar4._8_4_ * auVar4._8_4_;
  auVar5._12_4_ =
       auVar2._12_4_ * auVar2._12_4_ + auVar3._12_4_ * auVar3._12_4_ + auVar4._12_4_ * auVar4._12_4_
  ;
  auVar4 = vsqrtps_avx(auVar5);
  auVar3 = vmovshdup_avx(auVar4);
  return auVar4._0_4_ * auVar3._0_4_;
}

Assistant:

PBRT_CPU_GPU auto operator-(const Point3<U> &p) const
        -> Vector3<decltype(T{} - U{})> {
        DCHECK(!p.HasNaN());
        return {x - p.x, y - p.y, z - p.z};
    }